

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_int>::test_random_numerators<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom,
          divider<unsigned_int,_(libdivide::Branching)1> *the_divider)

{
  DivideTest<unsigned_int> *in_RDI;
  size_t j;
  size_t i;
  undefined8 local_28;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < 10000; local_20 = local_20 + 1) {
    for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
      get_random(in_RDI);
      test_one<(libdivide::Branching)1>
                ((DivideTest<unsigned_int> *)the_divider,i._4_4_,(uint)i,
                 (divider<unsigned_int,_(libdivide::Branching)1> *)j);
    }
  }
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }